

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSingularFieldHasBits
          (MessageGenerator *this,FieldDescriptor *field,Formatter *format)

{
  FieldDescriptor *pFVar1;
  FieldDescriptor FVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  LogMessage *other;
  char *format_00;
  char *format_01;
  undefined1 local_98 [32];
  Hex local_78;
  code *local_68 [7];
  
  if (*(char *)(*(long *)(field + 0x38) + 0x4f) != '\0') {
    format_01 = 
    "inline bool $classname$::has_$name$() const {\n$annotate_has$  return _weak_field_map_.Has($number$);\n}\n"
    ;
    goto LAB_002a345f;
  }
  FVar2 = field[1];
  if (((byte)FVar2 & 2) == 0) {
    if ((((byte)FVar2 & 0x60) == 0x20) && (*(char *)(*(long *)(field + 0x10) + 0x3a) == '\x02')) {
      if ((((byte)FVar2 & 0x10) == 0) || (*(long *)(field + 0x28) == 0)) goto LAB_002a32f4;
    }
    else if (((byte)FVar2 & 0x60) == 0x40) goto LAB_002a32f4;
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_68[0] = FieldDescriptor::TypeOnceInit;
      local_98._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),local_68,(FieldDescriptor **)local_98);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) != 10) {
      return;
    }
    bVar3 = IsLazy(field,&this->options_,this->scc_analyzer_);
    format_00 = 
    "inline bool $classname$::_internal_has_$name$() const {\n  return this != internal_default_instance() && $name$_ != nullptr;\n}\n"
    ;
    if (bVar3) {
      format_00 = 
      "inline bool $classname$::_internal_has_$name$() const {\n  return !$name$_.IsCleared();\n}\n"
      ;
    }
    format_01 = 
    "inline bool $classname$::has_$name$() const {\n$annotate_has$  return _internal_has_$name$();\n}\n"
    ;
  }
  else {
LAB_002a32f4:
    iVar4 = HasBitIndex(this,field);
    if (iVar4 == -1) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0x468);
      other = internal::LogMessage::operator<<
                        ((LogMessage *)local_68,"CHECK failed: (has_bit_index) != (kNoHasbit): ");
      internal::LogFinisher::operator=((LogFinisher *)local_98,other);
      internal::LogMessage::~LogMessage((LogMessage *)local_68);
    }
    pFVar1 = (FieldDescriptor *)(local_98 + 0x10);
    local_98._0_8_ = pFVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"has_array_index","");
    iVar5 = iVar4 + 0x1f;
    if (-1 < iVar4) {
      iVar5 = iVar4;
    }
    local_78.value = CONCAT44(local_78.value._4_4_,iVar5 >> 5);
    Formatter::Set<int>(format,(string *)local_98,(int *)&local_78);
    if ((FieldDescriptor *)local_98._0_8_ != pFVar1) {
      operator_delete((void *)local_98._0_8_);
    }
    local_98._0_8_ = pFVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"has_mask","");
    local_78.value = (uint64)(uint)(1 << ((byte)iVar4 & 0x1f));
    local_78.spec = ZERO_PAD_8;
    Formatter::Set<google::protobuf::strings::Hex>(format,(string *)local_98,&local_78);
    if ((FieldDescriptor *)local_98._0_8_ != pFVar1) {
      operator_delete((void *)local_98._0_8_);
    }
    Formatter::operator()<>
              (format,
               "inline bool $classname$::_internal_has_$name$() const {\n  bool value = (_has_bits_[$has_array_index$] & 0x$has_mask$u) != 0;\n"
              );
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_98._0_8_ = FieldDescriptor::TypeOnceInit;
      local_78.value = (uint64)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_98,
                 (FieldDescriptor **)&local_78);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) != 10) {
      format_01 = 
      "  return value;\n}\ninline bool $classname$::has_$name$() const {\n$annotate_has$  return _internal_has_$name$();\n}\n"
      ;
      goto LAB_002a345f;
    }
    bVar3 = IsLazy(field,&this->options_,this->scc_analyzer_);
    format_01 = 
    "  return value;\n}\ninline bool $classname$::has_$name$() const {\n$annotate_has$  return _internal_has_$name$();\n}\n"
    ;
    if (bVar3) goto LAB_002a345f;
    format_00 = "  PROTOBUF_ASSUME(!value || $name$_ != nullptr);\n";
  }
  Formatter::operator()<>(format,format_00);
LAB_002a345f:
  Formatter::operator()<>(format,format_01);
  return;
}

Assistant:

void MessageGenerator::GenerateSingularFieldHasBits(
    const FieldDescriptor* field, Formatter format) {
  if (IsFieldStripped(field, options_)) {
    format(
        "inline bool $classname$::has_$name$() const { "
        "__builtin_trap(); }\n");
    return;
  }
  if (field->options().weak()) {
    format(
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_has$"
        "  return _weak_field_map_.Has($number$);\n"
        "}\n");
    return;
  }
  if (HasHasbit(field)) {
    int has_bit_index = HasBitIndex(field);
    GOOGLE_CHECK_NE(has_bit_index, kNoHasbit);

    format.Set("has_array_index", has_bit_index / 32);
    format.Set("has_mask",
               strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
    format(
        "inline bool $classname$::_internal_has_$name$() const {\n"
        "  bool value = "
        "(_has_bits_[$has_array_index$] & 0x$has_mask$u) != 0;\n");

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !IsLazy(field, options_, scc_analyzer_)) {
      // We maintain the invariant that for a submessage x, has_x() returning
      // true implies that x_ is not null. By giving this information to the
      // compiler, we allow it to eliminate unnecessary null checks later on.
      format("  PROTOBUF_ASSUME(!value || $name$_ != nullptr);\n");
    }

    format(
        "  return value;\n"
        "}\n"
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_has$"
        "  return _internal_has_$name$();\n"
        "}\n");
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    // Message fields have a has_$name$() method.
    if (IsLazy(field, options_, scc_analyzer_)) {
      format(
          "inline bool $classname$::_internal_has_$name$() const {\n"
          "  return !$name$_.IsCleared();\n"
          "}\n");
    } else {
      format(
          "inline bool $classname$::_internal_has_$name$() const {\n"
          "  return this != internal_default_instance() "
          "&& $name$_ != nullptr;\n"
          "}\n");
    }
    format(
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_has$"
        "  return _internal_has_$name$();\n"
        "}\n");
  }
}